

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.h
# Opt level: O3

bool __thiscall QVersionNumber::isPrefixOf(QVersionNumber *this,QVersionNumber *other)

{
  byte bVar1;
  byte bVar2;
  QList<int> *pQVar3;
  QList<int> *pQVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  qsizetype qVar8;
  ulong uVar9;
  
  bVar1 = (this->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    lVar5 = (((this->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar5 = (long)((char)bVar1 >> 1);
  }
  bVar2 = (other->m_segments).field_0.inline_segments[0];
  if ((bVar2 & 1) == 0) {
    qVar8 = (((other->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    qVar8 = (qsizetype)((char)bVar2 >> 1);
  }
  if (lVar5 <= qVar8) {
    pQVar3 = (this->m_segments).field_0.pointer_segments;
    pQVar4 = (other->m_segments).field_0.pointer_segments;
    uVar9 = 0;
    do {
      if ((bVar1 & 1) == 0) {
        if ((pQVar3->d).size <= (long)uVar9) {
          return true;
        }
        iVar6 = (pQVar3->d).ptr[uVar9];
      }
      else {
        if ((long)((char)bVar1 >> 1) <= (long)uVar9) {
          return true;
        }
        iVar6 = (int)(this->m_segments).field_0.inline_segments[uVar9 + 1];
      }
      if ((bVar2 & 1) == 0) {
        if (uVar9 < (ulong)(pQVar4->d).size) {
          iVar7 = (pQVar4->d).ptr[uVar9];
        }
        else {
LAB_0038a898:
          iVar7 = 0;
        }
      }
      else {
        if ((long)((char)bVar2 >> 1) <= (long)uVar9) goto LAB_0038a898;
        iVar7 = (int)(other->m_segments).field_0.inline_segments[uVar9 + 1];
      }
      uVar9 = uVar9 + 1;
    } while (iVar6 == iVar7);
  }
  return false;
}

Assistant:

qsizetype size() const noexcept
        { return isUsingPointer() ? pointer_segments->size() : (inline_segments[InlineSegmentMarker] >> 1); }